

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O3

double3 * tinyusdz::vcross(double3 *a,double3 *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double3 *in_RDI;
  
  dVar1 = b->_M_elems[0];
  dVar2 = a->_M_elems[0];
  dVar3 = a->_M_elems[1];
  dVar4 = a->_M_elems[2];
  dVar5 = b->_M_elems[1];
  dVar6 = b->_M_elems[2];
  in_RDI->_M_elems[0] = dVar6 * dVar3 - dVar4 * dVar5;
  in_RDI->_M_elems[1] = dVar1 * dVar4 - dVar2 * dVar6;
  in_RDI->_M_elems[2] = dVar2 * dVar5 - dVar1 * dVar3;
  return in_RDI;
}

Assistant:

value::double3 vcross(const value::double3 &a, const value::double3 &b)
{
  value::double3 n;
  n[0] = a[1] * b[2] - a[2] * b[1];
  n[1] = a[2] * b[0] - a[0] * b[2];
  n[2] = a[0] * b[1] - a[1] * b[0];

  return n;
}